

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selection_widgets.cpp
# Opt level: O2

void fix_feedback_for_inter(Am_Object *inter)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object feedback;
  Am_Object widget;
  Am_Object local_18;
  Am_Object feedback_owner;
  
  Am_Object::Get_Owner(&widget,(Am_Slot_Flags)inter);
  in_value = Am_Object::Get(inter,0xdc,0);
  Am_Object::Am_Object(&feedback,in_value);
  Am_Object::Get_Owner(&feedback_owner,(Am_Slot_Flags)&feedback);
  bVar1 = Am_Object::operator!=(&feedback_owner,&widget);
  if (bVar1) {
    Am_Object::Remove_From_Owner(&feedback);
    Am_Object::Am_Object(&local_18,&feedback);
    Am_Object::Add_Part(&widget,&local_18,true,0);
    Am_Object::~Am_Object(&local_18);
  }
  Am_Object::~Am_Object(&feedback_owner);
  Am_Object::~Am_Object(&feedback);
  Am_Object::~Am_Object(&widget);
  return;
}

Assistant:

void
fix_feedback_for_inter(Am_Object &inter)
{
  Am_Object widget = inter.Get_Owner();
  Am_Object feedback = inter.Get(Am_FEEDBACK_OBJECT);
  Am_Object feedback_owner = feedback.Get_Owner();
  if (feedback_owner != widget) {
    feedback.Remove_From_Owner();
    widget.Add_Part(feedback);
  }
}